

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombinationFederate.cpp
# Opt level: O2

string * __thiscall
helics::CombinationFederate::localQuery_abi_cxx11_
          (string *__return_storage_ptr__,CombinationFederate *this,string_view queryStr)

{
  string local_40;
  
  helics::ValueFederate::localQuery_abi_cxx11_
            (__return_storage_ptr__,&this->super_ValueFederate,queryStr);
  if (__return_storage_ptr__->_M_string_length == 0) {
    helics::MessageFederate::localQuery_abi_cxx11_
              (&local_40,(MessageFederate *)&(this->super_ValueFederate).field_0x10,queryStr);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CombinationFederate::localQuery(std::string_view queryStr) const
{
    std::string res = ValueFederate::localQuery(queryStr);
    if (res.empty()) {
        res = MessageFederate::localQuery(queryStr);
    }
    return res;
}